

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O1

string * pybind11::type_id<char_const*&>(void)

{
  string *in_RDI;
  allocator local_11;
  
  std::__cxx11::string::string((string *)in_RDI,_PyType_Type + (*_PyType_Type == '*'),&local_11);
  detail::clean_type_id(in_RDI);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}